

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O3

bool __thiscall cs::event_type::touch(event_type *this,void *arg)

{
  _Any_data *p_Var1;
  _Any_data *p_Var2;
  bool bVar3;
  _Any_data *p_Var4;
  void *local_30;
  
  p_Var1 = (_Any_data *)(this->m_listener).m_start;
  p_Var2 = (_Any_data *)(this->m_listener).m_current;
  do {
    p_Var4 = p_Var2;
    if (p_Var4 == p_Var1) break;
    local_30 = arg;
    if (*(long *)(p_Var4 + -1) == 0) {
      std::__throw_bad_function_call();
    }
    bVar3 = (**(code **)(p_Var4->_M_pod_data + -8))(p_Var4 + -2,&local_30);
    p_Var2 = p_Var4 + -2;
  } while (!bVar3);
  return p_Var4 != p_Var1;
}

Assistant:

bool touch(void *arg)
		{
			for (auto &listener: m_listener)
				if (listener(arg))
					return true;
			return false;
		}